

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

void duckdb::ParseDirpathFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_409;
  _Function_base local_408;
  code *local_3f0;
  LogicalType local_3e8 [24];
  LogicalType local_3d0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  LogicalType local_3a0 [24];
  ScalarFunction func;
  ScalarFunction local_260;
  ScalarFunction local_138;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_3d0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_3d0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3b8,__l,&local_409);
  duckdb::LogicalType::LogicalType(local_3e8,VARCHAR);
  local_408._M_functor._8_8_ = 0;
  local_408._M_functor._M_unused._M_object = ParseDirpathFunction;
  local_3f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_408._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_3a0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&func,&local_3b8,local_3e8,&local_408,0,0,0,0,local_3a0,0,1,0);
  duckdb::LogicalType::~LogicalType(local_3a0);
  std::_Function_base::~_Function_base(&local_408);
  duckdb::LogicalType::~LogicalType(local_3e8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b8);
  duckdb::LogicalType::~LogicalType(local_3d0);
  ScalarFunction::ScalarFunction(&local_138,&func);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_138);
  ScalarFunction::~ScalarFunction(&local_138);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&func.field_0x48,
             (LogicalTypeId *)&LogicalType::VARCHAR);
  ScalarFunction::ScalarFunction(&local_260,&func);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_260);
  ScalarFunction::~ScalarFunction(&local_260);
  ScalarFunction::~ScalarFunction(&func);
  return;
}

Assistant:

ScalarFunctionSet ParseDirpathFun::GetFunctions() {
	ScalarFunctionSet parse_dirpath;
	ScalarFunction func({LogicalType::VARCHAR}, LogicalType::VARCHAR, ParseDirpathFunction, nullptr, nullptr, nullptr,
	                    nullptr, LogicalType::INVALID, FunctionStability::CONSISTENT,
	                    FunctionNullHandling::SPECIAL_HANDLING);
	parse_dirpath.AddFunction(func);
	// separator options
	func.arguments.emplace_back(LogicalType::VARCHAR);
	parse_dirpath.AddFunction(func);
	return parse_dirpath;
}